

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

Type * slang::ast::UnpackedStructType::fromSyntax(ASTContext *context,StructUnionTypeSyntax *syntax)

{
  Token *this;
  undefined1 *puVar1;
  byte *pbVar2;
  TokenKind TVar3;
  Compilation *args;
  size_t sVar4;
  SyntaxNode *syntax_00;
  DeclaratorSyntax *decl;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar5;
  int iVar6;
  UnpackedStructType *pUVar7;
  ulong uVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  Type *pTVar10;
  uint64_t uVar11;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  pointer ppSVar12;
  StructUnionMemberSyntax *pSVar13;
  uint64_t uVar14;
  long lVar15;
  SourceRange sourceRange;
  FieldSymbol *field;
  uint64_t bitOffset;
  SmallVector<const_slang::ast::FieldSymbol_*,_5UL> fields;
  RandMode local_e4;
  FieldSymbol *local_e0;
  unsigned_long local_d8;
  StructUnionTypeSyntax *local_d0;
  Compilation *local_c8;
  StructUnionMemberSyntax *local_c0;
  uint local_b4;
  ASTContext *local_b0;
  Scope *local_a8;
  pointer local_a0;
  pointer local_98;
  ulong local_90;
  SourceLocation local_88;
  string_view local_80;
  SmallVectorBase<const_slang::ast::FieldSymbol_*> local_70 [2];
  
  args = ((context->scope).ptr)->compilation;
  local_70[0].data_ = (pointer)parsing::Token::location(&syntax->keyword);
  local_c8 = args;
  local_b0 = context;
  pUVar7 = BumpAllocator::
           emplace<slang::ast::UnpackedStructType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::ASTContext_const&>
                     (&args->super_BumpAllocator,args,(SourceLocation *)local_70,context);
  uVar14 = 0;
  local_d8 = 0;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  sVar4 = (syntax->members).
          super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  src = extraout_RDX;
  local_d0 = syntax;
  if (sVar4 != 0) {
    ppSVar12 = (syntax->members).
               super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
    local_a0 = ppSVar12 + sVar4;
    local_a8 = &pUVar7->super_Scope;
    uVar14 = 0;
    do {
      local_c0 = *ppSVar12;
      syntax_00 = (local_c0->super_SyntaxNode).previewNode;
      if (syntax_00 != (SyntaxNode *)0x0) {
        Scope::addMembers(local_a8,syntax_00);
        src = extraout_RDX_00;
      }
      TVar3 = (local_c0->randomQualifier).kind;
      if (TVar3 == RandCKeyword) {
        local_e4 = RandC;
LAB_00249eb9:
        bVar5 = false;
      }
      else {
        if (TVar3 == RandKeyword) {
          local_e4 = Rand;
          goto LAB_00249eb9;
        }
        local_e4 = None;
        bVar5 = true;
      }
      uVar8 = (local_c0->declarators).elements._M_extent._M_extent_value + 1;
      local_98 = ppSVar12;
      if (1 < uVar8) {
        uVar8 = uVar8 >> 1;
        lVar15 = 0;
        pSVar13 = local_c0;
        do {
          local_90 = uVar8;
          ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                              ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                               ((long)&(((pSVar13->declarators).elements._M_ptr)->
                                       super_ConstTokenOrSyntax).
                                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                               + lVar15));
          decl = (DeclaratorSyntax *)*ppSVar9;
          this = &decl->name;
          local_80 = parsing::Token::valueText(this);
          local_88 = parsing::Token::location(this);
          local_b4 = (uint)local_70[0].len;
          local_e0 = BumpAllocator::
                     emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_long&,unsigned_int>
                               (&local_c8->super_BumpAllocator,&local_80,&local_88,&local_d8,
                                &local_b4);
          pSVar13 = local_c0;
          (local_e0->super_VariableSymbol).super_ValueSymbol.declaredType.typeOrLink =
               (anon_union_8_2_f12d5f64_for_typeOrLink)(local_c0->type).ptr;
          puVar1 = &(local_e0->super_VariableSymbol).super_ValueSymbol.declaredType.field_0x3f;
          *puVar1 = *puVar1 & 0x7f;
          ValueSymbol::setFromDeclarator((ValueSymbol *)local_e0,decl);
          syntax_01._M_ptr =
               (pSVar13->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_01._M_extent._M_extent_value =
               (pSVar13->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes((Symbol *)local_e0,(local_b0->scope).ptr,syntax_01);
          local_e0->randMode = local_e4;
          if (!bVar5) {
            pbVar2 = (byte *)((long)&(local_e0->super_VariableSymbol).super_ValueSymbol.declaredType
                                     .flags.m_bits + 1);
            *pbVar2 = *pbVar2 | 2;
          }
          Scope::insertMember(local_a8,(Symbol *)local_e0,(pUVar7->super_Scope).lastMember,false,
                              true);
          SmallVectorBase<slang::ast::FieldSymbol_const*>::
          emplace_back<slang::ast::FieldSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::FieldSymbol_const*> *)local_70,&local_e0);
          pTVar10 = DeclaredType::getType
                              (&(local_e0->super_VariableSymbol).super_ValueSymbol.declaredType);
          uVar11 = Type::getSelectableWidth(pTVar10);
          local_d8 = local_d8 + uVar11;
          pTVar10 = DeclaredType::getType
                              (&(local_e0->super_VariableSymbol).super_ValueSymbol.declaredType);
          uVar11 = Type::getBitstreamWidth(pTVar10);
          if ((0x3fffffff8 < local_d8) || (uVar14 = uVar14 + uVar11, 0x3fffffff8 < uVar14)) {
            sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_d0);
            ASTContext::addDiag(local_b0,(DiagCode)0x180009,sourceRange);
            pUVar7 = (UnpackedStructType *)local_c8->errorType;
            goto LAB_0024a0d3;
          }
          lVar15 = lVar15 + 0x30;
          uVar8 = local_90 - 1;
          src = extraout_RDX_01;
        } while (uVar8 != 0);
      }
      ppSVar12 = local_98 + 1;
    } while (ppSVar12 != local_a0);
  }
  pUVar7->selectableWidth = local_d8;
  pUVar7->bitstreamWidth = uVar14;
  iVar6 = SmallVectorBase<const_slang::ast::FieldSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)local_c8,src);
  (pUVar7->fields)._M_ptr = (pointer)CONCAT44(extraout_var,iVar6);
  (pUVar7->fields)._M_extent._M_extent_value = extraout_RDX_02;
  if (extraout_RDX_02 != 0) {
    lVar15 = 0;
    do {
      DeclaredType::getInitializer
                ((DeclaredType *)(*(long *)((long)CONCAT44(extraout_var,iVar6) + lVar15) + 0x40));
      lVar15 = lVar15 + 8;
    } while (extraout_RDX_02 * 8 - lVar15 != 0);
  }
  (pUVar7->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)local_d0;
LAB_0024a0d3:
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return &pUVar7->super_Type;
}

Assistant:

const Type& UnpackedStructType::fromSyntax(const ASTContext& context,
                                           const StructUnionTypeSyntax& syntax) {
    SLANG_ASSERT(!syntax.packed);

    auto& comp = context.getCompilation();
    auto result = comp.emplace<UnpackedStructType>(comp, syntax.keyword.location(), context);

    uint64_t bitOffset = 0;
    uint64_t bitstreamWidth = 0;
    SmallVector<const FieldSymbol*> fields;
    for (auto member : syntax.members) {
        if (member->previewNode)
            result->addMembers(*member->previewNode);

        RandMode randMode = RandMode::None;
        switch (member->randomQualifier.kind) {
            case TokenKind::RandKeyword:
                randMode = RandMode::Rand;
                break;
            case TokenKind::RandCKeyword:
                randMode = RandMode::RandC;
                break;
            default:
                break;
        }

        for (auto decl : member->declarators) {
            auto field = comp.emplace<FieldSymbol>(decl->name.valueText(), decl->name.location(),
                                                   bitOffset, (uint32_t)fields.size());
            field->setDeclaredType(*member->type);
            field->setFromDeclarator(*decl);
            field->setAttributes(*context.scope, member->attributes);
            field->randMode = randMode;

            if (randMode != RandMode::None)
                field->getDeclaredType()->addFlags(DeclaredTypeFlags::Rand);

            result->addMember(*field);
            fields.push_back(field);

            bitOffset += field->getType().getSelectableWidth();
            bitstreamWidth += field->getType().getBitstreamWidth();
            if (bitOffset > MaxBitWidth || bitstreamWidth > MaxBitWidth) {
                context.addDiag(diag::ObjectTooLarge, syntax.sourceRange());
                return comp.getErrorType();
            }
        }
    }

    result->selectableWidth = bitOffset;
    result->bitstreamWidth = bitstreamWidth;
    result->fields = fields.copy(comp);
    for (auto field : result->fields) {
        // Force resolution of the initializer right away, otherwise nothing
        // is required to force it later.
        field->getInitializer();
    }

    result->setSyntax(syntax);
    return *result;
}